

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

bool __thiscall wirehair::Codec::AllocateWorkspace(Codec *this)

{
  PeelRefs *pPVar1;
  ushort uVar2;
  uint8_t *puVar3;
  ulong size;
  PeelRow *pPVar4;
  ushort uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar2 = this->_block_count;
  uVar10 = (ulong)uVar2;
  uVar8 = uVar2 + 1 + (uint)this->_mix_count;
  lVar9 = (ulong)this->_block_bytes * (ulong)uVar8;
  uVar7 = (ulong)((uint)this->_extra_count + (uint)uVar2);
  size = lVar9 + uVar10 * 0x48 + uVar7 * 0x19;
  puVar3 = this->_recovery_blocks;
  uVar5 = uVar2;
  if (this->_workspace_allocated < size) {
    if (puVar3 != (uint8_t *)0x0) {
      SIMDSafeFree(puVar3);
      this->_recovery_blocks = (uint8_t *)0x0;
    }
    this->_workspace_allocated = 0;
    puVar3 = SIMDSafeAllocate(size);
    this->_recovery_blocks = puVar3;
    if (puVar3 == (uint8_t *)0x0) {
      return false;
    }
    this->_workspace_allocated = size;
    uVar5 = this->_block_count;
  }
  this->_peel_rows = (PeelRow *)(puVar3 + lVar9);
  pPVar4 = (PeelRow *)(puVar3 + lVar9) + uVar7;
  pPVar1 = (PeelRefs *)((long)&pPVar4->RecoveryId + uVar10 * 6);
  this->_peel_cols = (PeelColumn *)pPVar4;
  this->_peel_col_refs = pPVar1;
  this->_copied_original = (uint8_t *)(pPVar1->Rows + uVar10 + (ulong)uVar2 * 0x20 + -1);
  this->_recovery_rows = uVar8;
  if (uVar5 != 0) {
    lVar9 = 0;
    lVar6 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + 1;
      *(undefined2 *)((long)this->_peel_col_refs->Rows + lVar6 + -2) = 0;
      puVar3 = (uint8_t *)((long)&pPVar4->RecoveryId + lVar9 + 2);
      puVar3[0] = '\0';
      puVar3[1] = '\0';
      lVar6 = lVar6 + 0x42;
      pPVar4 = (PeelRow *)this->_peel_cols;
      *(undefined1 *)((long)&pPVar4->NextRow + lVar9) = 0;
      lVar9 = lVar9 + 6;
    } while (uVar7 < this->_block_count);
  }
  return true;
}

Assistant:

bool Codec::AllocateWorkspace()
{
    CAT_IF_DUMP(cout << endl << "---- AllocateWorkspace ----" << endl << endl;)

    // +1 for temporary space for MultiplyDenseValues()
    const unsigned recovery_rows = _block_count + _mix_count + 1;
    const uint64_t recoverySizeBytes = static_cast<uint64_t>(recovery_rows) * _block_bytes;

    // Count needed rows and columns
    const uint32_t row_count = _block_count + _extra_count;
    const uint32_t column_count = _block_count;

    // Calculate size
    const uint64_t sizeBytes = recoverySizeBytes
        + sizeof(PeelRow) * row_count
        + sizeof(PeelColumn) * column_count
        + sizeof(PeelRefs) * column_count
        + row_count;

    if (_workspace_allocated < sizeBytes)
    {
        FreeWorkspace();

        // Allocate workspace
        _recovery_blocks = SIMDSafeAllocate((size_t)sizeBytes);
        if (!_recovery_blocks) {
            return false;
        }
        _workspace_allocated = sizeBytes;
    }

    // Set pointers
    _peel_rows = reinterpret_cast<PeelRow *>( _recovery_blocks + recoverySizeBytes );
    _peel_cols = reinterpret_cast<PeelColumn *>( _peel_rows + row_count );
    _peel_col_refs = reinterpret_cast<PeelRefs *>( _peel_cols + column_count );
    _copied_original = reinterpret_cast<uint8_t *>( _peel_col_refs + column_count );

    _recovery_rows = recovery_rows;

    CAT_IF_DUMP(cout << "Memory overhead for workspace = " << sizeBytes << " bytes" << endl;)

    // Initialize columns
    for (unsigned ii = 0; ii < _block_count; ++ii)
    {
        _peel_col_refs[ii].RowCount = 0;
        _peel_cols[ii].Weight2Refs = 0;
        _peel_cols[ii].Mark = MARK_TODO;
    }

    return true;
}